

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O3

mat4 * __thiscall Camera::GetViewMatrix(Camera *this)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  ulong uVar8;
  mat4 *in_RDI;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  fVar1 = (this->Position).field_2.z;
  fVar11 = (this->Up).field_0.x;
  fVar9 = ((this->Front).field_2.z + fVar1) - fVar1;
  *(undefined8 *)&in_RDI->value[1].field_3 = 0;
  in_RDI->value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  in_RDI->value[2].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  *(undefined8 *)&in_RDI->value[0].field_3 = 0;
  in_RDI->value[1].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  in_RDI->value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  in_RDI->value[2].field_3.w = 0.0;
  in_RDI->value[3].field_3.w = 1.0;
  uVar2 = (this->Position).field_0;
  uVar5 = (this->Position).field_1;
  uVar3 = (this->Front).field_0;
  uVar6 = (this->Front).field_1;
  uVar4 = (this->Up).field_1;
  uVar7 = (this->Up).field_2;
  fVar12 = ((float)uVar3 + (float)uVar2) - (float)uVar2;
  fVar13 = ((float)uVar6 + (float)uVar5) - (float)uVar5;
  fVar10 = 1.0 / SQRT(fVar13 * fVar13 + fVar12 * fVar12 + fVar9 * fVar9);
  fVar9 = fVar9 * fVar10;
  fVar12 = fVar10 * fVar12;
  fVar10 = fVar10 * fVar13;
  fVar13 = fVar11 * fVar9 - (float)uVar7 * fVar12;
  fVar14 = (float)uVar4 * fVar12 - fVar10 * fVar11;
  fVar15 = (float)uVar7 * fVar10 - fVar9 * (float)uVar4;
  fVar11 = 1.0 / SQRT(fVar15 * fVar15 + fVar13 * fVar13 + fVar14 * fVar14);
  fVar15 = fVar15 * fVar11;
  fVar13 = fVar13 * fVar11;
  fVar11 = fVar11 * fVar14;
  fVar16 = fVar13 * fVar9 - fVar11 * fVar10;
  fVar17 = fVar11 * fVar12 - fVar15 * fVar9;
  in_RDI->value[0].field_0.x = fVar15;
  in_RDI->value[1].field_0.x = fVar13;
  in_RDI->value[2].field_0.x = fVar11;
  in_RDI->value[0].field_1.y = fVar16;
  fVar14 = fVar10 * fVar15 - fVar13 * fVar12;
  in_RDI->value[1].field_1.y = fVar17;
  in_RDI->value[2].field_1.y = fVar14;
  in_RDI->value[0].field_2.z = -fVar12;
  in_RDI->value[1].field_2.z = -fVar10;
  in_RDI->value[2].field_2.z = -fVar9;
  uVar8 = CONCAT44(fVar14 * fVar1 + fVar17 * (float)uVar5 + (float)uVar2 * fVar16,
                   fVar11 * fVar1 + fVar15 * (float)uVar2 + (float)uVar5 * fVar13) ^
          0x8000000080000000;
  in_RDI->value[3].field_0 =
       (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)(int)uVar8;
  in_RDI->value[3].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)(int)(uVar8 >> 0x20);
  in_RDI->value[3].field_2.z = fVar10 * (float)uVar5 + fVar12 * (float)uVar2 + fVar9 * fVar1;
  return in_RDI;
}

Assistant:

glm::mat4 GetViewMatrix() const {
        return glm::lookAt(this->Position, this->Position + this->Front, this->Up);
    }